

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall
CInput::CJoystick::CJoystick(CJoystick *this,CInput *pInput,int Index,SDL_Joystick *pDelegate)

{
  long lVar1;
  undefined4 uVar2;
  _func_int **in_RCX;
  undefined4 in_EDX;
  _func_int **in_RSI;
  IJoystick *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  char *src;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  IInput::IJoystick::IJoystick(in_RDI);
  in_RDI->_vptr_IJoystick = (_func_int **)&PTR_GetIndex_002979b0;
  in_RDI[1]._vptr_IJoystick = in_RSI;
  *(undefined4 *)&in_RDI[2]._vptr_IJoystick = in_EDX;
  in_RDI[0x12]._vptr_IJoystick = in_RCX;
  uVar2 = SDL_JoystickNumAxes(in_RCX);
  *(undefined4 *)((long)&in_RDI[0xf]._vptr_IJoystick + 4) = uVar2;
  uVar2 = SDL_JoystickNumButtons(in_RCX);
  *(undefined4 *)&in_RDI[0x10]._vptr_IJoystick = uVar2;
  uVar2 = SDL_JoystickNumBalls(in_RCX);
  *(undefined4 *)((long)&in_RDI[0x10]._vptr_IJoystick + 4) = uVar2;
  uVar2 = SDL_JoystickNumHats(in_RCX);
  *(undefined4 *)&in_RDI[0x11]._vptr_IJoystick = uVar2;
  src = (char *)((long)&in_RDI[2]._vptr_IJoystick + 4);
  SDL_JoystickName(in_RCX);
  str_copy((char *)in_RDI,src,0);
  auVar3 = SDL_JoystickGetGUID(in_RCX);
  SDL_JoystickGetGUIDString
            (auVar3._0_8_,auVar3._8_8_,(undefined1 *)((long)&in_RDI[10]._vptr_IJoystick + 4),0x22);
  uVar2 = SDL_JoystickInstanceID(in_RCX);
  *(undefined4 *)&in_RDI[0xf]._vptr_IJoystick = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CInput::CJoystick::CJoystick(CInput *pInput, int Index, SDL_Joystick *pDelegate)
{
	m_pInput = pInput;
	m_Index = Index;
	m_pDelegate = pDelegate;
	m_NumAxes = SDL_JoystickNumAxes(pDelegate);
	m_NumButtons = SDL_JoystickNumButtons(pDelegate);
	m_NumBalls = SDL_JoystickNumBalls(pDelegate);
	m_NumHats = SDL_JoystickNumHats(pDelegate);
	str_copy(m_aName, SDL_JoystickName(pDelegate), sizeof(m_aName));
	SDL_JoystickGetGUIDString(SDL_JoystickGetGUID(pDelegate), m_aGUID, sizeof(m_aGUID));
	m_InstanceID = SDL_JoystickInstanceID(pDelegate);
}